

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v6::detail::buffer<char>_>
fmt::v6::detail::
write_ptr<char,std::back_insert_iterator<fmt::v6::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v6::detail::buffer<char>_> out,unsigned_long value,
          basic_format_specs<char> *specs)

{
  int value_00;
  type tVar1;
  checked_ptr<typename_buffer<char>::value_type> it;
  char *pcVar2;
  undefined1 local_48 [8];
  anon_class_16_2_92d121e5 write;
  size_t size;
  int num_digits;
  basic_format_specs<char> *specs_local;
  unsigned_long value_local;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> out_local;
  
  value_local = (unsigned_long)out.container;
  value_00 = count_digits<4u,unsigned_long>(value);
  tVar1 = to_unsigned<int>(value_00);
  write._8_8_ = (ulong)tVar1 + 2;
  local_48 = (undefined1  [8])value;
  write.value._0_4_ = value_00;
  if (specs == (basic_format_specs<char> *)0x0) {
    it = reserve<fmt::v6::detail::buffer<char>,_0>
                   ((back_insert_iterator<fmt::v6::detail::buffer<char>_>)value_local,write._8_8_);
    pcVar2 = write_ptr<char,_std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_unsigned_long>
             ::anon_class_16_2_92d121e5::operator()((anon_class_16_2_92d121e5 *)local_48,it);
    out_local = base_iterator<fmt::v6::detail::buffer<char>,_0>
                          ((back_insert_iterator<fmt::v6::detail::buffer<char>_> *)&value_local,
                           pcVar2);
  }
  else {
    out_local = write_padded<(fmt::v6::align::type)2,std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::write_ptr<char,std::back_insert_iterator<fmt::v6::detail::buffer<char>>,unsigned_long>(std::back_insert_iterator<fmt::v6::detail::buffer<char>>,unsigned_long,fmt::v6::basic_format_specs<char>const*)::_lambda(char*)_1_>
                          ((back_insert_iterator<fmt::v6::detail::buffer<char>_>)value_local,specs,
                           write._8_8_,(anon_class_16_2_92d121e5 *)local_48);
  }
  return (back_insert_iterator<fmt::v6::detail::buffer<char>_>)out_local.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}